

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void __thiscall amrex::FABio_8bit::skip(FABio_8bit *this,istream *is,FArrayBox *f)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  BaseFab<double> *in_RDX;
  void *in_RSI;
  int k;
  int nbytes;
  Real mx;
  Real mn;
  Long siz;
  Box *bx;
  int local_48;
  int local_44;
  Box *in_stack_ffffffffffffffc0;
  double local_38;
  Long local_30;
  Box *local_28;
  BaseFab<double> *local_20;
  void *local_18;
  char *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = BaseFab<double>::box(in_RDX);
  local_30 = Box::numPts(in_stack_ffffffffffffffc0);
  for (local_48 = 0; iVar1 = BaseFab<double>::nComp(local_20), local_48 < iVar1;
      local_48 = local_48 + 1) {
    pvVar2 = (void *)std::istream::operator>>(local_18,&local_38);
    pvVar2 = (void *)std::istream::operator>>(pvVar2,(double *)&stack0xffffffffffffffc0);
    std::istream::operator>>(pvVar2,&local_44);
    do {
      iVar1 = std::istream::get();
    } while (iVar1 != 10);
    std::istream::seekg((long)local_18,(_Ios_Seekdir)local_30);
  }
  uVar3 = std::ios::fail();
  if ((uVar3 & 1) != 0) {
    local_8 = "FABio_8bit::skip() failed";
    Error_host((char *)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void
FABio_8bit::skip (std::istream& is,
                  FArrayBox&    f) const
{
    const Box& bx = f.box();
    Long siz      = bx.numPts();
    Real mn, mx;
    for(int nbytes, k = 0; k < f.nComp(); ++k) {
        is >> mn >> mx >> nbytes;
        BL_ASSERT(nbytes == siz);
        while(is.get() != '\n') {
            ;  // ---- do nothing
        }
        is.seekg(siz, std::ios::cur);
    }

    if(is.fail()) {
        amrex::Error("FABio_8bit::skip() failed");
    }
}